

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatBilerpTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatBilerpTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::TextureMapping2DHandle_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ FloatBilerpTexture mapping: %s v00: %f v01: %f v10: %f v11: %f ]",&this->mapping,
             &this->v00,&this->v01,&this->v10,&this->v11);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatBilerpTexture::ToString() const {
    return StringPrintf(
        "[ FloatBilerpTexture mapping: %s v00: %f v01: %f v10: %f v11: %f ]", mapping,
        v00, v01, v10, v11);
}